

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O0

void __thiscall xtest::AssertFail::~AssertFail(AssertFail *this)

{
  AssertFail *this_local;
  
  ~AssertFail(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

AssertFail(const char *case_name,const char *msg,const char *file_path,unsigned int line){
            std::stringstream ss;
            ss << "[ASSERT]"
               << '\"'
               #if XTEST_OUTPUT_FULL_PATH
               << file_path
               #else
               << getFileName(file_path)
               #endif
               << "\" line "
               << line
               << " in \""
               << case_name
               << "\": "
               << msg;
            m_message = ss.str();
        }